

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3CursorSeekStmt(Fts3Cursor *pCsr,sqlite3_stmt **ppStmt)

{
  char **pzTail;
  char *in_RSI;
  sqlite3 *in_RDI;
  char *zSql;
  Fts3Table *p;
  int rc;
  sqlite3_vfs *ppStmt_00;
  int nBytes;
  
  nBytes = 0;
  if (in_RDI->pDfltColl == (CollSeq *)0x0) {
    ppStmt_00 = in_RDI->pVfs;
    pzTail = (char **)sqlite3_mprintf("SELECT %s WHERE rowid = ?",ppStmt_00[2].xDlSym);
    if (pzTail == (char **)0x0) {
      return 7;
    }
    nBytes = sqlite3_prepare_v2(in_RDI,in_RSI,nBytes,(sqlite3_stmt **)ppStmt_00,pzTail);
    sqlite3_free((void *)0x1be934);
  }
  *(CollSeq **)in_RSI = in_RDI->pDfltColl;
  return nBytes;
}

Assistant:

static int fts3CursorSeekStmt(Fts3Cursor *pCsr, sqlite3_stmt **ppStmt){
  int rc = SQLITE_OK;
  if( pCsr->pStmt==0 ){
    Fts3Table *p = (Fts3Table *)pCsr->base.pVtab;
    char *zSql;
    zSql = sqlite3_mprintf("SELECT %s WHERE rowid = ?", p->zReadExprlist);
    if( !zSql ) return SQLITE_NOMEM;
    rc = sqlite3_prepare_v2(p->db, zSql, -1, &pCsr->pStmt, 0);
    sqlite3_free(zSql);
  }
  *ppStmt = pCsr->pStmt;
  return rc;
}